

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

string * anon_unknown.dwarf_1785d::stripLeadingUnderscore
                   (string *__return_storage_ptr__,string *name)

{
  pointer Input;
  char (*Separator) [3];
  reference pvVar1;
  char *pcVar2;
  uint local_58;
  uint i;
  is_any_ofF<char> local_48;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string *name_local;
  
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = name;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_30);
  Input = names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  boost::algorithm::is_any_of<char[3]>(&local_48,(char (*) [3])"::");
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30,Input,&local_48,token_compress_on);
  boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_48);
  local_58 = 0;
  while( true ) {
    Separator = (char (*) [3])
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_30);
    if (Separator <= (char (*) [3])(ulong)local_58) break;
    pvVar1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_30,(ulong)local_58);
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)pvVar1);
    if (*pcVar2 == '_') {
      pvVar1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_30,(ulong)local_58);
      std::__cxx11::string::erase((ulong)pvVar1,0);
    }
    local_58 = local_58 + 1;
  }
  boost::algorithm::
  join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>
            (__return_storage_ptr__,(algorithm *)local_30,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)"::",Separator);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return __return_storage_ptr__;
}

Assistant:

static string stripLeadingUnderscore(string const &name) {
        vector<string> names;
        split(names, name, is_any_of("::"), boost::token_compress_on);

        for (unsigned int i = 0; i < names.size(); i++) {
            if (names[i][0] == '_') {
                names[i].erase(0, 1);
            }
        }

        return join(names, "::");
    }